

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_support_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *needs_support)

{
  int iVar1;
  REF_GEOM pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  REF_BOOL has_id;
  int local_5c;
  REF_BOOL *local_58;
  ulong local_50;
  ulong local_48;
  REF_GRID local_40;
  long local_38;
  
  pRVar2 = ref_grid->geom;
  *needs_support = 0;
  local_48 = 0xffffffff;
  if (-1 < node0) {
    local_48 = 0xffffffff;
    if (node0 < pRVar2->ref_adj->nnode) {
      local_48 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node0];
    }
  }
  if ((int)local_48 != -1) {
    iVar5 = pRVar2->ref_adj->item[(int)local_48].ref;
    local_50 = (ulong)(uint)node1;
    local_58 = needs_support;
    local_40 = ref_grid;
    do {
      uVar9 = 0xffffffff;
      if (-1 < node1) {
        uVar9 = 0xffffffff;
        if (node1 < pRVar2->ref_adj->nnode) {
          uVar9 = (ulong)(uint)pRVar2->ref_adj->first[local_50];
        }
      }
      if ((int)uVar9 != -1) {
        iVar7 = pRVar2->ref_adj->item[(int)uVar9].ref;
        lVar8 = (long)(iVar5 * 6 + 1);
        local_38 = lVar8;
        do {
          pRVar3 = pRVar2->descr;
          if (((pRVar3[iVar5 * 6] == 2) && (pRVar3[iVar7 * 6] == 2)) &&
             (pRVar3[lVar8] == pRVar3[(int)(iVar7 * 6 | 1)])) {
            uVar6 = ref_cell_side_has_id(local_40->cell[3],node0,node1,pRVar3[lVar8],&local_5c);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x5b2,"ref_geom_support_between",(ulong)uVar6,"has edge id");
              return uVar6;
            }
            lVar8 = local_38;
            if (local_5c != 0) {
              *local_58 = 1;
              return 0;
            }
          }
          pRVar4 = pRVar2->ref_adj->item;
          iVar1 = pRVar4[(int)uVar9].next;
          uVar9 = (ulong)iVar1;
          if (uVar9 == 0xffffffffffffffff) {
            iVar7 = -1;
          }
          else {
            iVar7 = pRVar4[uVar9].ref;
          }
        } while (iVar1 != -1);
      }
      pRVar4 = pRVar2->ref_adj->item;
      iVar7 = pRVar4[(int)local_48].next;
      local_48 = (ulong)iVar7;
      if (local_48 == 0xffffffffffffffff) {
        iVar5 = -1;
      }
      else {
        iVar5 = pRVar4[local_48].ref;
      }
    } while (iVar7 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_support_between(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1,
                                            REF_BOOL *needs_support) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item0, item1;
  REF_INT geom0, geom1;
  REF_INT type, id;
  REF_BOOL has_id;

  *needs_support = REF_FALSE;
  /* assume face check is sufficient */
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node0, item0, geom0)
      each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node1, item1,
                                      geom1) {
    type = REF_GEOM_FACE;
    if (ref_geom_type(ref_geom, geom0) == type &&
        ref_geom_type(ref_geom, geom1) == type &&
        ref_geom_id(ref_geom, geom0) == ref_geom_id(ref_geom, geom1)) {
      id = ref_geom_id(ref_geom, geom0);
      RSS(ref_cell_side_has_id(ref_grid_tri(ref_grid), node0, node1, id,
                               &has_id),
          "has edge id");
      if (has_id) {
        *needs_support = REF_TRUE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}